

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O2

void __thiscall
QGraphicsLinearLayout::removeItem(QGraphicsLinearLayout *this,QGraphicsLayoutItem *item)

{
  QGraphicsLinearLayoutPrivate *this_00;
  QGraphicsGridLayoutEngineItem *gridItem;
  
  this_00 = (QGraphicsLinearLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  gridItem = QGraphicsGridLayoutEngine::findLayoutItem(&this_00->engine,item);
  if (gridItem != (QGraphicsGridLayoutEngineItem *)0x0) {
    QGraphicsLayoutItem::setParentLayoutItem(item,(QGraphicsLayoutItem *)0x0);
    QGraphicsLinearLayoutPrivate::removeGridItem(this_00,&gridItem->super_QGridLayoutItem);
    (**(code **)(*(long *)gridItem + 8))(gridItem);
    (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
    return;
  }
  return;
}

Assistant:

void QGraphicsLinearLayout::removeItem(QGraphicsLayoutItem *item)
{
    Q_D(QGraphicsLinearLayout);
    if (QGraphicsGridLayoutEngineItem *gridItem = d->engine.findLayoutItem(item)) {
        item->setParentLayoutItem(nullptr);
        d->removeGridItem(gridItem);
        delete gridItem;
        invalidate();
    }
}